

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ObjCHelper_ParseSimple_DropsComments_Test::
~ObjCHelper_ParseSimple_DropsComments_Test(ObjCHelper_ParseSimple_DropsComments_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelper, ParseSimple_DropsComments) {
  const std::vector<std::pair<std::string, std::vector<std::string>>> tests = {
      {"# nothing", {}},
      {"#", {}},
      {"##", {}},
      {"\n# nothing\n", {}},
      {"a # same line", {"a"}},
      {"a # same line\n", {"a"}},
      {"a\n# line\nc", {"a", "c"}},
      {"# n o t # h i n g #", {}},
      {"## n o # t h i n g #", {}},
      {"a# n o t # h i n g #", {"a"}},
      {"a\n## n o # t h i n g #", {"a"}},
  };

  for (const auto& test : tests) {
    for (int i = 0; i < kBlockSizeCount; i++) {
      io::ArrayInputStream input(test.first.data(), (int)test.first.size(),
                                 kBlockSizes[i]);
      std::string err_str;
      std::vector<std::string> lines;
      TestLineCollector collector(&lines);
      EXPECT_TRUE(ParseSimpleStream(input, "dummy", &collector, &err_str));
      EXPECT_EQ(lines, test.second);
      EXPECT_TRUE(err_str.empty());
    }
  }
}